

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPla.c
# Opt level: O0

word ** Io_ReadPlaCubeSetup(Vec_Str_t *vSop)

{
  int iVar1;
  int iVar2;
  int iVar3;
  word **ppwVar4;
  word *pwVar5;
  bool bVar6;
  word **pCs;
  int v;
  int c;
  int nWords;
  int nVars;
  int nCubes;
  char Lit;
  char *pCube;
  char *pSop;
  Vec_Str_t *vSop_local;
  
  _nCubes = Vec_StrArray(vSop);
  iVar1 = Abc_SopGetCubeNum(_nCubes);
  iVar2 = Abc_SopGetVarNum(_nCubes);
  iVar3 = Abc_Bit6WordNum(iVar2 << 1);
  ppwVar4 = (word **)malloc((long)iVar1 << 3);
  pwVar5 = (word *)calloc((long)(iVar1 * iVar3),8);
  *ppwVar4 = pwVar5;
  for (pCs._4_4_ = 1; pCs._4_4_ < iVar1; pCs._4_4_ = pCs._4_4_ + 1) {
    ppwVar4[pCs._4_4_] = ppwVar4[pCs._4_4_ + -1] + iVar3;
  }
  pCs._4_4_ = 0;
  for (; *_nCubes != '\0'; _nCubes = _nCubes + (iVar2 + 3)) {
    pCs._0_4_ = 0;
    while( true ) {
      bVar6 = false;
      if (_nCubes[(int)pCs] != ' ') {
        nVars._3_1_ = _nCubes[(int)pCs];
        bVar6 = nVars._3_1_ != '\0';
      }
      if (!bVar6) break;
      if (nVars._3_1_ == '0') {
        pwVar5 = ppwVar4[pCs._4_4_];
        iVar3 = Abc_Var2Lit((int)pCs,0);
        Abc_TtSetBit(pwVar5,iVar3);
      }
      else if (nVars._3_1_ == '1') {
        pwVar5 = ppwVar4[pCs._4_4_];
        iVar3 = Abc_Var2Lit((int)pCs,1);
        Abc_TtSetBit(pwVar5,iVar3);
      }
      pCs._0_4_ = (int)pCs + 1;
    }
    pCs._4_4_ = pCs._4_4_ + 1;
  }
  if (pCs._4_4_ != iVar1) {
    __assert_fail("c == nCubes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioReadPla.c"
                  ,0x104,"word **Io_ReadPlaCubeSetup(Vec_Str_t *)");
  }
  return ppwVar4;
}

Assistant:

word ** Io_ReadPlaCubeSetup( Vec_Str_t * vSop )
{
    char * pSop = Vec_StrArray( vSop ), * pCube, Lit;
    int nCubes  = Abc_SopGetCubeNum( pSop );
    int nVars   = Abc_SopGetVarNum( pSop );
    int nWords  = Abc_Bit6WordNum( 2*nVars ), c, v;
    word ** pCs = ABC_ALLOC( word *, nCubes );
    pCs[0] = ABC_CALLOC( word, nCubes * nWords );
    for ( c = 1; c < nCubes; c++ )
        pCs[c] = pCs[c-1] + nWords;
    c = 0;
    Abc_SopForEachCube( pSop, nVars, pCube )
    {
        Abc_CubeForEachVar( pCube, Lit, v )
            if ( Lit == '0' )
                Abc_TtSetBit( pCs[c], Abc_Var2Lit(v,0) );
            else if ( Lit == '1' )
                Abc_TtSetBit( pCs[c], Abc_Var2Lit(v,1) );
        c++;
    }
    assert( c == nCubes );
    return pCs;
}